

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<QString>(PromiseError *this,QString *value)

{
  QString *this_00;
  QString *value_local;
  PromiseError *this_local;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&this->m_data);
  this_00 = (QString *)__cxa_allocate_exception(0x18);
  QString::QString(this_00,value);
  __cxa_throw(this_00,&QString::typeinfo,QString::~QString);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }